

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeLiteGenerator::CreateNewProjectFile
          (cmExtraCodeLiteGenerator *this,cmGeneratorTarget *gt,string *filename)

{
  _Base_ptr *pp_Var1;
  cmMakefile *makefile;
  pointer pcVar2;
  TargetType TVar3;
  string *psVar4;
  char *this_00;
  string targetName;
  string projectPath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  cFiles;
  string visualname;
  string projectType;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherFiles;
  cmXMLWriter xml;
  cmGeneratedFileStream fout;
  
  makefile = gt->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
    cmXMLWriter::StartDocument(&xml,"utf-8");
    pp_Var1 = &cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    cFiles._M_t._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cFiles,"CodeLite_Project","");
    cmXMLWriter::StartElement(&xml,(string *)&cFiles);
    if ((_Base_ptr *)cFiles._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)cFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
    targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&targetName,pcVar2,pcVar2 + psVar4->_M_string_length);
    visualname._M_dataplus._M_p = (pointer)&visualname.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&visualname,targetName._M_dataplus._M_p,
               targetName._M_dataplus._M_p + targetName._M_string_length);
    TVar3 = cmGeneratorTarget::GetType(gt);
    if (TVar3 - STATIC_LIBRARY < 3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cFiles,
                     "lib",&targetName);
      std::__cxx11::string::operator=((string *)&visualname,(string *)&cFiles);
      if ((_Base_ptr *)cFiles._M_t._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)cFiles._M_t._M_impl._0_8_,
                        (ulong)((long)&(cFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
    }
    cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"Name",&visualname);
    this_00 = "InternalType";
    cmXMLWriter::Attribute<char[1]>(&xml,"InternalType",(char (*) [1])0x518362);
    projectType._M_string_length = 0;
    projectType.field_2._M_local_buf[0] = '\0';
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &otherFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    projectType._M_dataplus._M_p = (pointer)&projectType.field_2;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    CollectSourceFiles(&projectPath,(cmExtraCodeLiteGenerator *)this_00,makefile,gt,&cFiles,
                       &otherFiles);
    std::__cxx11::string::operator=((string *)&projectType,(string *)&projectPath);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projectPath._M_dataplus._M_p != &projectPath.field_2) {
      operator_delete(projectPath._M_dataplus._M_p,projectPath.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetFilenamePath(&projectPath,filename);
    CreateProjectSourceEntries
              (this,&cFiles,&otherFiles,&xml,&projectPath,makefile,&projectType,&targetName);
    cmXMLWriter::EndElement(&xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projectPath._M_dataplus._M_p != &projectPath.field_2) {
      operator_delete(projectPath._M_dataplus._M_p,projectPath.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&otherFiles._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::~_Rb_tree(&cFiles._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projectType._M_dataplus._M_p != &projectType.field_2) {
      operator_delete(projectType._M_dataplus._M_p,
                      CONCAT71(projectType.field_2._M_allocated_capacity._1_7_,
                               projectType.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)visualname._M_dataplus._M_p != &visualname.field_2) {
      operator_delete(visualname._M_dataplus._M_p,visualname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetName._M_dataplus._M_p != &targetName.field_2) {
      operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::~cmXMLWriter(&xml);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateNewProjectFile(
  const cmGeneratorTarget* gt, const std::string& filename)
{
  const cmMakefile* mf = gt->Makefile;
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }
  cmXMLWriter xml(fout);

  ////////////////////////////////////
  xml.StartDocument("utf-8");
  xml.StartElement("CodeLite_Project");
  std::string targetName = gt->GetName();
  std::string visualname = targetName;
  switch (gt->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      visualname = "lib" + targetName;
    default: // intended fallthrough
      break;
  }
  xml.Attribute("Name", visualname);
  xml.Attribute("InternalType", "");

  // Collect all used source files in the project
  // Sort them into two containers, one for C/C++ implementation files
  // which may have an accompanying header, one for all other files
  std::string projectType;

  std::map<std::string, cmSourceFile*> cFiles;
  std::set<std::string> otherFiles;

  projectType = CollectSourceFiles(mf, gt, cFiles, otherFiles);

  // Get the project path ( we need it later to convert files to
  // their relative path)
  std::string projectPath = cmSystemTools::GetFilenamePath(filename);

  CreateProjectSourceEntries(cFiles, otherFiles, &xml, projectPath, mf,
                             projectType, targetName);

  xml.EndElement(); // CodeLite_Project
}